

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QList<int> * __thiscall
QDockAreaLayout::findSeparator(QList<int> *__return_storage_ptr__,QDockAreaLayout *this,QPoint *pos)

{
  QDockAreaLayoutInfo *this_00;
  Representation RVar1;
  bool bVar2;
  char cVar3;
  Representation RVar4;
  Representation RVar5;
  int index;
  long lVar6;
  QPoint *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_60;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar7 = (QPoint *)&this->docks[0].rect;
  lVar6 = 0;
  do {
    if (lVar6 == 4) {
LAB_003cda7b:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    this_00 = (QDockAreaLayoutInfo *)(pQVar7 + -5);
    bVar2 = QDockAreaLayoutInfo::isEmpty(this_00);
    if (!bVar2) {
      stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      index = (int)lVar6;
      _local_48 = separatorRect(this,index);
      RVar1 = local_48._0_4_;
      RVar4 = local_48._8_4_;
      RVar5 = local_48._12_4_;
      if ((local_48._4_4_.m_i + -1 != RVar5.m_i || RVar1.m_i + -1 != RVar4.m_i) && (this->sep == 1))
      {
        local_48._4_4_ = local_48._4_4_.m_i + -2;
        local_48._0_4_ = RVar1.m_i + -2;
        local_48._8_4_ = RVar4.m_i + 2;
        RStack_3c.m_i = RVar5.m_i + 2;
      }
      cVar3 = QRect::contains((QPoint *)local_48,SUB81(pos,0));
      if (cVar3 != '\0') {
        bVar2 = QDockAreaLayoutInfo::hasFixedSize(this_00);
        if (!bVar2) {
          QList<int>::append(__return_storage_ptr__,index);
          goto LAB_003cda7b;
        }
      }
      cVar3 = QRect::contains(pQVar7,SUB81(pos,0));
      if (cVar3 != '\0') {
        QDockAreaLayoutInfo::findSeparator((QList<int> *)&local_60,this_00,pos);
        QArrayDataPointer<int>::operator=(&__return_storage_ptr__->d,&local_60);
        QArrayDataPointer<int>::~QArrayDataPointer(&local_60);
        if ((__return_storage_ptr__->d).size != 0) {
          QList<int>::prepend(__return_storage_ptr__,index);
          goto LAB_003cda7b;
        }
      }
    }
    lVar6 = lVar6 + 1;
    pQVar7 = pQVar7 + 0xe;
  } while( true );
}

Assistant:

QList<int> QDockAreaLayout::findSeparator(const QPoint &pos) const
{
    QList<int> result;
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &info = docks[i];
        if (info.isEmpty())
            continue;
        QRect rect = separatorRect(i);
        if (!rect.isNull() && sep == 1)
            rect.adjust(-2, -2, 2, 2);
        if (rect.contains(pos) && !info.hasFixedSize()) {
            result << i;
            break;
        } else if (info.rect.contains(pos)) {
            result = docks[i].findSeparator(pos);
            if (!result.isEmpty()) {
                result.prepend(i);
                break;
            }
        }
    }

    return result;
}